

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O3

void lsvm::hashset::resize_or_new_bucket(hashset *h,uint16_t bit)

{
  byte bVar1;
  uint uVar2;
  hashbucket **pphVar3;
  uint8_t i;
  ulong uVar4;
  hashbucket *phVar5;
  uint *puVar6;
  long lVar7;
  hashbucket *phVar8;
  equals_fp *pb;
  undefined6 in_register_00000032;
  equals_fp *b;
  
  pb = &h[1].equals + (CONCAT62(in_register_00000032,bit) & 0xffffffff);
  if ((hashbucket *)*pb != (hashbucket *)0x0) {
    b = (equals_fp *)0x0;
    phVar5 = (hashbucket *)pb;
    phVar8 = (hashbucket *)*pb;
    do {
      if (((ulong)phVar8->bucket_size_indx != 0x17) &&
         ((b == (equals_fp *)0x0 ||
          ((uint)(&primes)[phVar8->bucket_size_indx] < (uint)(&primes)[*(uint *)(*b + 0xc)])))) {
        b = (equals_fp *)phVar5;
      }
      pphVar3 = &phVar8->next;
      phVar5 = phVar8;
      phVar8 = *pphVar3;
    } while (*pphVar3 != (hashbucket *)0x0);
    if (b != (equals_fp *)0x0) {
      uVar2 = (&primes)[*(uint *)(*b + 0xc)];
      if ((uint)(*(int *)(*b + 8) * 100) / uVar2 < 0x4b) {
        uVar4 = 1;
        lVar7 = 0;
        do {
          if (uVar2 < *(uint *)((long)&primes + lVar7)) goto LAB_00105b2f;
          uVar4 = (ulong)(byte)((char)uVar4 + 1);
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0x5c);
      }
      else {
        uVar4 = 0;
        puVar6 = &primes;
        do {
          if (uVar2 < *puVar6) goto LAB_00105b2f;
          uVar4 = uVar4 + 1;
          puVar6 = puVar6 + 1;
        } while (uVar4 != 0x18);
      }
      uVar4 = 0x17;
LAB_00105b2f:
      if ((&primes)[uVar4 & 0xff] != uVar2) {
        copy_into_new_bucket(h,(hashbucket **)pb,(hashbucket **)b,(uint32_t)(uVar4 & 0xff));
        return;
      }
      bVar1 = h->new_bucket_indx;
      uVar2 = (&primes)[bVar1];
      goto LAB_00105b41;
    }
  }
  bVar1 = h->new_bucket_indx;
  uVar2 = (&primes)[bVar1];
LAB_00105b41:
  phVar5 = (hashbucket *)memory::allocate((ulong)uVar2 * 0x10 + 0x10);
  phVar5->next = (hashbucket_t *)0x0;
  phVar5->count = 0;
  phVar5->bucket_size_indx = (uint)bVar1;
  memset(phVar5 + 1,0,(ulong)uVar2 * 0x10);
  phVar5->next = (hashbucket *)*pb;
  *pb = (equals_fp)phVar5;
  return;
}

Assistant:

inline entry* entries(hashbucket* b) { return reinterpret_cast<entry*>(b+1); }